

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPolyn.c
# Opt level: O1

void Pln_ManStop(Pln_Man_t *p)

{
  Hsh_VecMan_t *pHVar1;
  Vec_Int_t *pVVar2;
  Vec_Que_t *__ptr;
  Vec_Flt_t *__ptr_00;
  
  pHVar1 = p->pHashC;
  pVVar2 = pHVar1->vTable;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = pHVar1->vData;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = pHVar1->vMap;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  free(pHVar1);
  pHVar1 = p->pHashM;
  pVVar2 = pHVar1->vTable;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = pHVar1->vData;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = pHVar1->vMap;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  free(pHVar1);
  __ptr = p->vQue;
  if (__ptr->pOrder != (int *)0x0) {
    free(__ptr->pOrder);
    __ptr->pOrder = (int *)0x0;
  }
  if (__ptr->pHeap != (int *)0x0) {
    free(__ptr->pHeap);
    __ptr->pHeap = (int *)0x0;
  }
  if (__ptr != (Vec_Que_t *)0x0) {
    free(__ptr);
  }
  __ptr_00 = p->vCounts;
  if (__ptr_00->pArray != (float *)0x0) {
    free(__ptr_00->pArray);
    __ptr_00->pArray = (float *)0x0;
  }
  if (__ptr_00 != (Vec_Flt_t *)0x0) {
    free(__ptr_00);
  }
  pVVar2 = p->vCoefs;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vTempC[0];
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vTempC[1];
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vTempM[0];
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vTempM[1];
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vTempM[2];
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vTempM[3];
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  if (p != (Pln_Man_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Pln_ManStop( Pln_Man_t * p )
{
    Hsh_VecManStop( p->pHashC );
    Hsh_VecManStop( p->pHashM );
    Vec_QueFree( p->vQue );
    Vec_FltFree( p->vCounts );
    Vec_IntFree( p->vCoefs );
    Vec_IntFree( p->vTempC[0] );
    Vec_IntFree( p->vTempC[1] );
    Vec_IntFree( p->vTempM[0] );
    Vec_IntFree( p->vTempM[1] );
    Vec_IntFree( p->vTempM[2] );
    Vec_IntFree( p->vTempM[3] );
    //Vec_IntFree( p->vOrder );
    ABC_FREE( p );
}